

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O2

void __thiscall irr::scene::CSceneManager::clearAllRegisteredNodesForRendering(CSceneManager *this)

{
  core::array<irr::scene::ISceneNode_*>::clear(&this->CameraList);
  core::array<irr::scene::ISceneNode_*>::clear(&this->SkyBoxList);
  core::array<irr::scene::CSceneManager::DefaultNodeEntry>::clear(&this->SolidNodeList);
  core::array<irr::scene::CSceneManager::TransparentNodeEntry>::clear(&this->TransparentNodeList);
  core::array<irr::scene::CSceneManager::TransparentNodeEntry>::clear
            (&this->TransparentEffectNodeList);
  core::array<irr::scene::ISceneNode_*>::clear(&this->GuiNodeList);
  return;
}

Assistant:

void CSceneManager::clearAllRegisteredNodesForRendering()
{
	CameraList.clear();
	SkyBoxList.clear();
	SolidNodeList.clear();
	TransparentNodeList.clear();
	TransparentEffectNodeList.clear();
	GuiNodeList.clear();
}